

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilsTest.hpp
# Opt level: O2

void Qentem::Test::TestCount(QTest *test)

{
  uint local_20;
  SizeT length;
  
  length = StringUtils::Count<char,unsigned_int>("");
  local_20 = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_20,0x4b);
  length = StringUtils::Count<char,unsigned_int>("a");
  local_20 = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_20,0x4e);
  length = StringUtils::Count<char,unsigned_int>("abcde");
  local_20 = 5;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_20,0x51);
  length = StringUtils::Count<char,unsigned_int>("");
  local_20 = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_20,0x54);
  length = StringUtils::Count<char,unsigned_int>("1234567");
  local_20 = 7;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_20,0x57);
  length = StringUtils::Count<char,unsigned_int>("123456781234567");
  local_20 = 0xf;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_20,0x5a);
  length = StringUtils::Count<char,unsigned_int>("1234567812345678123456781234567");
  local_20 = 0x1f;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_20,0x5d);
  length = StringUtils::Count<char,unsigned_int>
                     ("123456781234567812345678123456781234567812345678123456781234567");
  local_20 = 0x3f;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&length,&local_20,0x60);
  return;
}

Assistant:

static void TestCount(QTest &test) {
    SizeT length = StringUtils::Count("");
    test.IsEqual(length, 0U, __LINE__);

    length = StringUtils::Count("a");
    test.IsEqual(length, 1U, __LINE__);

    length = StringUtils::Count("abcde");
    test.IsEqual(length, 5U, __LINE__);

    length = StringUtils::Count("\0");
    test.IsEqual(length, 0U, __LINE__);

    length = StringUtils::Count("1234567");
    test.IsEqual(length, 7U, __LINE__);

    length = StringUtils::Count("123456781234567");
    test.IsEqual(length, 15U, __LINE__);

    length = StringUtils::Count("1234567812345678123456781234567");
    test.IsEqual(length, 31U, __LINE__);

    length = StringUtils::Count("123456781234567812345678123456781234567812345678123456781234567");
    test.IsEqual(length, 63U, __LINE__);
}